

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lockedpool.cpp
# Opt level: O2

void __thiscall LockedPool::free(LockedPool *this,void *__ptr)

{
  long lVar1;
  runtime_error *this_00;
  _List_node_base *p_Var2;
  long in_FS_OFFSET;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  std::mutex::lock(&this->mutex);
  p_Var2 = (_List_node_base *)&this->arenas;
  do {
    p_Var2 = (((_List_base<LockedPool::LockedPageArena,_std::allocator<LockedPool::LockedPageArena>_>
                *)&p_Var2->_M_next)->_M_impl)._M_node.super__List_node_base._M_next;
    if (p_Var2 == (_List_node_base *)&this->arenas) {
      this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::runtime_error::runtime_error
                (this_00,"LockedPool: invalid address not pointing to any arena");
      if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
        __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
      }
      goto LAB_00629a59;
    }
  } while ((__ptr < p_Var2[0xf]._M_next) || (p_Var2[0xf]._M_prev <= __ptr));
  Arena::free((Arena *)(p_Var2 + 1),__ptr);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    pthread_mutex_unlock((pthread_mutex_t *)&this->mutex);
    return;
  }
LAB_00629a59:
  __stack_chk_fail();
}

Assistant:

void LockedPool::free(void *ptr)
{
    std::lock_guard<std::mutex> lock(mutex);
    // TODO we can do better than this linear search by keeping a map of arena
    // extents to arena, and looking up the address.
    for (auto &arena: arenas) {
        if (arena.addressInArena(ptr)) {
            arena.free(ptr);
            return;
        }
    }
    throw std::runtime_error("LockedPool: invalid address not pointing to any arena");
}